

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_8::writeTileData
               (Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,uint64_t pixelDataSize,
               uint64_t unpackedDataSize,char *sampleCountTableData,uint64_t sampleCountTableSize)

{
  OutputStreamMutex *pOVar1;
  OStream *pOVar2;
  int iVar3;
  undefined4 extraout_var;
  uint64_t *puVar4;
  long lVar5;
  uint64_t local_4c;
  int local_44;
  uint64_t local_40;
  char *local_38;
  
  pOVar1 = ofd->_streamData;
  local_40 = pOVar1->currentPosition;
  pOVar1->currentPosition = 0;
  local_38 = pixelData;
  if (local_40 == 0) {
    iVar3 = (*pOVar1->os->_vptr_OStream[3])();
    local_40 = CONCAT44(extraout_var,iVar3);
  }
  local_44 = ly;
  puVar4 = TileOffsets::operator()(&ofd->tileOffsets,dx,dy,lx,ly);
  *puVar4 = local_40;
  if (ofd->multipart == true) {
    pOVar2 = ofd->_streamData->os;
    local_4c = CONCAT44(local_4c._4_4_,ofd->partNumber);
    (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,4);
  }
  pOVar2 = ofd->_streamData->os;
  local_4c._0_4_ = dx;
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,4);
  pOVar2 = ofd->_streamData->os;
  local_4c._0_4_ = dy;
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,4);
  pOVar2 = ofd->_streamData->os;
  local_4c._0_4_ = lx;
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,4);
  pOVar2 = ofd->_streamData->os;
  local_4c = CONCAT44(local_4c._4_4_,local_44);
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,4);
  pOVar2 = ofd->_streamData->os;
  local_4c = sampleCountTableSize;
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,8);
  pOVar2 = ofd->_streamData->os;
  local_4c = pixelDataSize;
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,8);
  pOVar2 = ofd->_streamData->os;
  local_4c = unpackedDataSize;
  (*pOVar2->_vptr_OStream[2])(pOVar2,&local_4c,8);
  pOVar2 = ofd->_streamData->os;
  (*pOVar2->_vptr_OStream[2])(pOVar2,sampleCountTableData,sampleCountTableSize & 0xffffffff);
  pOVar2 = ofd->_streamData->os;
  (*pOVar2->_vptr_OStream[2])(pOVar2,local_38,pixelDataSize & 0xffffffff);
  lVar5 = local_40 + pixelDataSize + sampleCountTableSize;
  pOVar1 = ofd->_streamData;
  pOVar1->currentPosition = lVar5 + 0x28;
  if (ofd->multipart == true) {
    pOVar1->currentPosition = lVar5 + 0x2c;
  }
  return;
}

Assistant:

void
writeTileData (
    DeepTiledOutputFile::Data* ofd,
    int                        dx,
    int                        dy,
    int                        lx,
    int                        ly,
    const char                 pixelData[],
    uint64_t                   pixelDataSize,
    uint64_t                   unpackedDataSize,
    const char                 sampleCountTableData[],
    uint64_t                   sampleCountTableSize)
{

    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    uint64_t currentPosition          = ofd->_streamData->currentPosition;
    ofd->_streamData->currentPosition = 0;

    if (currentPosition == 0) currentPosition = ofd->_streamData->os->tellp ();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

#ifdef DEBUG
    assert (ofd->_streamData->os->tellp () == currentPosition);
#endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write<StreamIO> (*ofd->_streamData->os, ofd->partNumber);
    }
    Xdr::write<StreamIO> (*ofd->_streamData->os, dx);
    Xdr::write<StreamIO> (*ofd->_streamData->os, dy);
    Xdr::write<StreamIO> (*ofd->_streamData->os, lx);
    Xdr::write<StreamIO> (*ofd->_streamData->os, ly);

    //
    // Write the packed size of the pixel sample count table (64 bits)
    //

    Xdr::write<StreamIO> (*ofd->_streamData->os, sampleCountTableSize);

    //
    // Write the packed and unpacked data size (64 bits each)
    //

    Xdr::write<StreamIO> (*ofd->_streamData->os, pixelDataSize);
    Xdr::write<StreamIO> (*ofd->_streamData->os, unpackedDataSize);

    //
    // Write the compressed pixel sample count table.
    //

    ofd->_streamData->os->write (
        sampleCountTableData, static_cast<int> (sampleCountTableSize));

    //
    // Write the compressed data.
    //

    ofd->_streamData->os->write (pixelData, static_cast<int> (pixelDataSize));

    //
    // Keep current position in the file so that we can avoid
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    ofd->_streamData->currentPosition =
        currentPosition + 4 * Xdr::size<int> () + // dx, dy, lx, ly,
        3 * Xdr::size<uint64_t> () +              // sampleCountTableSize,
                                                  // pixelDataSize,
                                                  // unpackedDataSize
        sampleCountTableSize + pixelDataSize;

    if (ofd->multipart)
    {
        ofd->_streamData->currentPosition += Xdr::size<int> ();
    }
}